

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,char *beginValue,char *endValue)

{
  char *pcVar1;
  char *endValue_local;
  char *beginValue_local;
  Value *this_local;
  
  initBasic(this,stringValue,true);
  pcVar1 = duplicateStringValue(beginValue,(int)endValue - (int)beginValue);
  (this->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value(const char* beginValue, const char* endValue) {
  initBasic(stringValue, true);
  value_.string_ =
      duplicateStringValue(beginValue, (unsigned int)(endValue - beginValue));
}